

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_LookForTID
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *actor;
  VMValue *pVVar2;
  bool bVar3;
  bool local_57;
  FLookExParams *pFStack_50;
  int u;
  FLookExParams *params;
  bool allaround;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x63a,
                  "int AF_AActor_LookForTID(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x63a,
                  "int AF_AActor_LookForTID(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  actor = (AActor *)(param->field_0).field_1.a;
  local_57 = true;
  if (actor != (AActor *)0x0) {
    local_57 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
  }
  if (local_57 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x63a,
                  "int AF_AActor_LookForTID(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x63b,
                  "int AF_AActor_LookForTID(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x63b,
                  "int AF_AActor_LookForTID(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  iVar1 = param[1].field_0.i;
  if (numparam < 3) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    bVar3 = false;
    if ((pVVar2->field_0).field_3.Type == '\x03') {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      bVar3 = (pVVar2->field_0).field_1.atag == 0;
    }
    if (!bVar3) {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x63c,
                    "int AF_AActor_LookForTID(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    pFStack_50 = (FLookExParams *)(pVVar2->field_0).field_1.a;
  }
  else {
    bVar3 = false;
    if (param[2].field_0.field_3.Type == '\x03') {
      bVar3 = param[2].field_0.field_1.atag == 0;
    }
    if (!bVar3) {
      __assert_fail("(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x63c,
                    "int AF_AActor_LookForTID(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pFStack_50 = (FLookExParams *)param[2].field_0.field_1.a;
  }
  bVar3 = P_LookForTID(actor,(uint)(iVar1 != 0),pFStack_50);
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x63d,
                    "int AF_AActor_LookForTID(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,(uint)bVar3);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, LookForTID)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL(allaround);
	PARAM_POINTER_DEF(params, FLookExParams);
	ACTION_RETURN_BOOL(P_LookForTID(self, allaround, params));
}